

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

SceneObject * __thiscall
CMU462::Application::init_sphere(Application *this,SphereInfo *sphere,Matrix4x4 *transform)

{
  double dVar1;
  Sphere *this_00;
  Vector3D local_a0;
  Vector4D local_88;
  Vector4D local_68;
  double local_48;
  double local_40;
  double local_38;
  
  local_88.z = 0.0;
  local_88.x = 0.0;
  local_88.y = 0.0;
  local_88.w = 1.0;
  Matrix4x4::operator*(transform,&local_88);
  Vector4D::projectTo3D(&local_68);
  local_88.x = 1.0;
  local_88.y = 0.0;
  local_88.z = 0.0;
  local_88.w = 0.0;
  Matrix4x4::operator*(transform,&local_88);
  Vector4D::to3D(&local_68);
  dVar1 = local_38 * local_38 + local_48 * local_48 + local_40 * local_40;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  this_00 = (Sphere *)operator_new(0x120);
  DynamicScene::Sphere::Sphere(this_00,sphere,&local_a0,dVar1);
  return &this_00->super_SceneObject;
}

Assistant:

DynamicScene::SceneObject *Application::init_sphere(
    SphereInfo &sphere, const Matrix4x4 &transform) {
  const Vector3D &position = (transform * Vector4D(0, 0, 0, 1)).projectTo3D();
  double scale = (transform * Vector4D(1, 0, 0, 0)).to3D().norm();
  return new DynamicScene::Sphere(sphere, position, scale);
}